

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O3

void __thiscall
BaseUser::BaseUser(BaseUser *this,char *passedFirstName,char *passedLastName,char *passedEmail,
                  char *passedPassword,bool passedAdmin)

{
  undefined1 *__dest;
  int iVar1;
  long lVar2;
  BaseUser *pBVar3;
  undefined3 in_register_00000089;
  allocator local_6d;
  undefined4 local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  
  local_6c = CONCAT31(in_register_00000089,passedAdmin);
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_0012c840;
  local_68 = passedFirstName;
  local_60 = passedLastName;
  local_58 = passedPassword;
  if (Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar1 = 1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      (&Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar1 = *(int *)(lVar2 + 0x30) + 1;
  }
  (this->super_Model<BaseUser>).id = iVar1;
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_0012bef8;
  __dest = &(this->super_Model<BaseUser>).field_0xc;
  memset(__dest,0,0xe0);
  this->admin = SUB41(local_6c,0);
  strcpy(__dest,local_68);
  strcpy(this->lastName,local_60);
  strcpy(this->password,local_58);
  strcpy(this->email,passedEmail);
  std::__cxx11::string::string((string *)&local_50,passedEmail,&local_6d);
  pBVar3 = findByEmail(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (pBVar3 != (BaseUser *)0x0) {
    (this->super_Model<BaseUser>).id = (pBVar3->super_Model<BaseUser>).id;
  }
  return;
}

Assistant:

BaseUser::BaseUser(const char *passedFirstName, const char *passedLastName, const char *passedEmail,
                   const char *passedPassword, bool passedAdmin) : admin(passedAdmin) {
    strcpy(firstName, passedFirstName);
    strcpy(lastName, passedLastName);
    strcpy(password, passedPassword);
    strcpy(email, passedEmail);
    BaseUser *user = BaseUser::findByEmail(passedEmail);
    if(user) id = user->getId();
}